

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::LE_Fire_PDU::SetQuantityRateFlag(LE_Fire_PDU *this,KBOOL F)

{
  KBOOL F_local;
  LE_Fire_PDU *this_local;
  
  if (F != (KBOOL)((this->m_FireFlagUnion).m_ui8Flag >> 5 & 1)) {
    (this->m_FireFlagUnion).m_ui8Flag = (this->m_FireFlagUnion).m_ui8Flag & 0xdf | F << 5;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 4;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 4;
    }
  }
  return;
}

Assistant:

void LE_Fire_PDU::SetQuantityRateFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_FireFlagUnion.m_ui8QuantRate )return;

    m_FireFlagUnion.m_ui8QuantRate = F;

    if( F )
    {
        m_ui16PDULength += 4; // 4 = size of quantity and  fields in the Munition Descriptor.
    }
    else
    {
        m_ui16PDULength -= 4;
    }
}